

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

bool AM_checkSpecialBoundary
               (line_t_conflict *line,_func_bool_int_int_ptr *function,int *specialptr,int **argsptr
               )

{
  bool bVar1;
  bool bVar2;
  int *specialptr_00;
  int **argsptr_00;
  
  specialptr_00 = &AM_checkSpecialBoundary::sink;
  if (specialptr != (int *)0x0) {
    specialptr_00 = specialptr;
  }
  argsptr_00 = &AM_checkSpecialBoundary(line_t&,bool(*)(int,int*),int*,int**)::sink;
  if (argsptr != (int **)0x0) {
    argsptr_00 = argsptr;
  }
  if ((line->activation & 0x4db) != 0) {
    bVar1 = (*function)(line->special,line->args);
    if (bVar1) {
      *specialptr_00 = line->special;
      *argsptr_00 = line->args;
      return true;
    }
  }
  bVar1 = AM_checkSectorActions
                    (line->frontsector,function,specialptr_00,argsptr_00,
                     line->backsector == (sector_t_conflict *)0x0);
  bVar2 = true;
  if (!bVar1) {
    if (line->backsector != (sector_t_conflict *)0x0) {
      bVar1 = AM_checkSectorActions(line->backsector,function,specialptr_00,argsptr_00,false);
      return bVar1;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool AM_checkSpecialBoundary (line_t &line, bool (*function)(int, int *), int *specialptr = NULL, int **argsptr = NULL)
{
	if (specialptr == NULL)
	{
		static int sink;
		specialptr = &sink;
	}

	if (argsptr == NULL)
	{
		static int *sink;
		argsptr = &sink;
	}

	// Check if the line special qualifies for this
	if ((line.activation & SPAC_PlayerActivate) && (*function)(line.special, line.args))
	{
		*specialptr = line.special;
		*argsptr = line.args;
		return true;
	}

	// Check sector actions in the line's front sector -- the action has to be use-activated in order to
	// show up if this is a one-sided line, because the player cannot trigger sector actions by crossing
	// a one-sided line (since that's impossible, duh).
	if (AM_checkSectorActions(line.frontsector, function, specialptr, argsptr, line.backsector == NULL))
		return true;

	// If it has a back sector, check sector actions in that.
	return (line.backsector && AM_checkSectorActions(line.backsector, function, specialptr, argsptr, false));
}